

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_setup(MppBufSlots slots,RK_S32 count)

{
  __pthread_internal_list *p_Var1;
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  RK_S32 count_local;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_setup");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((buf_slot_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_buf_slot","slot %p setup: count %d\n",(char *)0x0,slots,(ulong)(uint)count);
    }
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_38,*slots,1);
    if (auto_lock.mLock[5].mMutex.__data.__list.__next == (__pthread_internal_list *)0x0) {
      *(RK_S32 *)((long)&(auto_lock.mLock)->mMutex + 0x20) = count;
      auto_lock.mLock[2].mMutex.__data.__kind = count;
      p_Var1 = (__pthread_internal_list *)mpp_osal_calloc("mpp_buf_slot_setup",(long)count * 0x38);
      auto_lock.mLock[5].mMutex.__data.__list.__next = p_Var1;
      init_slot_entry((MppBufSlotsImpl *)auto_lock.mLock,0,count);
      *(undefined4 *)((long)&auto_lock.mLock[2].mMutex + 0x14) = 0;
    }
    else {
      if (auto_lock.mLock[2].mMutex.__data.__kind < count) {
        p_Var1 = (__pthread_internal_list *)
                 mpp_osal_realloc("mpp_buf_slot_setup",
                                  auto_lock.mLock[5].mMutex.__data.__list.__next,(long)count * 0x38)
        ;
        auto_lock.mLock[5].mMutex.__data.__list.__next = p_Var1;
        if ((auto_lock.mLock[5].mMutex.__data.__list.__next == (__pthread_internal_list *)0x0) &&
           (_mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                       "mpp_buf_slot_setup",0x394), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        init_slot_entry((MppBufSlotsImpl *)auto_lock.mLock,auto_lock.mLock[2].mMutex.__data.__kind,
                        count - auto_lock.mLock[2].mMutex.__data.__kind);
      }
      *(RK_S32 *)((long)&(auto_lock.mLock)->mMutex + 0x20) = count;
    }
    slots_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)local_38);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_setup(MppBufSlots slots, RK_S32 count)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    buf_slot_dbg(BUF_SLOT_DBG_SETUP, "slot %p setup: count %d\n", slots, count);

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);

    if (NULL == impl->slots) {
        // first slot setup
        impl->buf_count = impl->new_count = count;
        impl->slots = mpp_calloc(MppBufSlotEntry, count);
        init_slot_entry(impl, 0, count);
        impl->used_count = 0;
    } else {
        // record the slot count for info changed ready config
        if (count > impl->buf_count) {
            impl->slots = mpp_realloc(impl->slots, MppBufSlotEntry, count);
            mpp_assert(impl->slots);
            init_slot_entry(impl, impl->buf_count, (count - impl->buf_count));
        }
        impl->new_count = count;
    }

    return MPP_OK;
}